

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_container * cram_new_container(int nrec,int nslice)

{
  cram_container *__ptr;
  cram_slice **ppcVar1;
  cram_block_compression_hdr *pcVar2;
  cram_stats *pcVar3;
  kh_s_i2i_t *pkVar4;
  uint local_24;
  cram_DS_ID id;
  cram_container *c;
  int nslice_local;
  int nrec_local;
  
  __ptr = (cram_container *)calloc(1,0x250);
  if (__ptr != (cram_container *)0x0) {
    __ptr->curr_ref = -2;
    __ptr->max_c_rec = nrec * nslice;
    __ptr->curr_c_rec = 0;
    __ptr->max_rec = nrec;
    __ptr->record_counter = 0;
    __ptr->num_bases = 0;
    __ptr->max_slice = nslice;
    __ptr->curr_slice = 0;
    __ptr->pos_sorted = 1;
    __ptr->max_apos = 0;
    __ptr->multi_seq = 0;
    __ptr->bams = (bam_seq_t **)0x0;
    ppcVar1 = (cram_slice **)calloc((long)nslice,8);
    __ptr->slices = ppcVar1;
    if (ppcVar1 != (cram_slice **)0x0) {
      __ptr->slice = (cram_slice *)0x0;
      pcVar2 = cram_new_compression_header();
      __ptr->comp_hdr = pcVar2;
      if (pcVar2 != (cram_block_compression_hdr *)0x0) {
        __ptr->comp_hdr_block = (cram_block *)0x0;
        for (local_24 = 0xb; local_24 < 0x27; local_24 = local_24 + 1) {
          pcVar3 = cram_stats_create();
          __ptr->stats[local_24] = pcVar3;
          if (pcVar3 == (cram_stats *)0x0) goto LAB_00144051;
        }
        pkVar4 = kh_init_s_i2i();
        __ptr->tags_used = pkVar4;
        if (pkVar4 != (kh_s_i2i_t *)0x0) {
          __ptr->refs_used = (int *)0x0;
          return __ptr;
        }
      }
    }
LAB_00144051:
    if (__ptr != (cram_container *)0x0) {
      if (__ptr->slices != (cram_slice **)0x0) {
        free(__ptr->slices);
      }
      free(__ptr);
    }
  }
  return (cram_container *)0x0;
}

Assistant:

cram_container *cram_new_container(int nrec, int nslice) {
    cram_container *c = calloc(1, sizeof(*c));
    enum cram_DS_ID id;

    if (!c)
	return NULL;

    c->curr_ref = -2;

    c->max_c_rec = nrec * nslice;
    c->curr_c_rec = 0;

    c->max_rec = nrec;
    c->record_counter = 0;
    c->num_bases = 0;

    c->max_slice = nslice;
    c->curr_slice = 0;

    c->pos_sorted = 1;
    c->max_apos   = 0;
    c->multi_seq  = 0;

    c->bams = NULL;

    if (!(c->slices = (cram_slice **)calloc(nslice, sizeof(cram_slice *))))
	goto err;
    c->slice = NULL;

    if (!(c->comp_hdr = cram_new_compression_header()))
	goto err;
    c->comp_hdr_block = NULL;

    for (id = DS_RN; id < DS_TN; id++)
	if (!(c->stats[id] = cram_stats_create())) goto err;
    
    //c->aux_B_stats = cram_stats_create();

    if (!(c->tags_used = kh_init(s_i2i)))
	goto err;
    c->refs_used = 0;

    return c;

 err:
    if (c) {
	if (c->slices)
	    free(c->slices);
	free(c);
    }
    return NULL;
}